

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O0

void __thiscall net_uv::KCPSocket::connectResult(KCPSocket *this,int32_t status)

{
  bool bVar1;
  int32_t status_local;
  KCPSocket *this_local;
  
  bVar1 = std::function::operator_cast_to_bool((function *)&(this->super_Socket).m_connectCall);
  if (bVar1) {
    std::function<void_(net_uv::Socket_*,_int)>::operator()
              (&(this->super_Socket).m_connectCall,&this->super_Socket,status);
  }
  if (status != 1) {
    changeState(this,CLOSED);
    shutdownSocket(this);
  }
  return;
}

Assistant:

void KCPSocket::connectResult(int32_t status)
{
	if (m_connectCall)
		m_connectCall(this, status);

	if (status != 1)
	{
		this->changeState(State::CLOSED);
		this->shutdownSocket();
	}
}